

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureVkImpl.cpp
# Opt level: O0

void __thiscall Diligent::TextureVkImpl::~TextureVkImpl(TextureVkImpl *this)

{
  void *in_RSI;
  TextureVkImpl *this_local;
  
  ~TextureVkImpl(this);
  RefCountedObject<Diligent::ITextureVk>::operator_delete
            ((RefCountedObject<Diligent::ITextureVk> *)this,in_RSI);
  return;
}

Assistant:

TextureVkImpl::~TextureVkImpl()
{
    // Vk object can only be destroyed when it is no longer used by the GPU
    // Wrappers for external texture will not be destroyed as they are created with null device pointer
    if (m_VulkanImage)
        m_pDevice->SafeReleaseDeviceObject(std::move(m_VulkanImage), m_Desc.ImmediateContextMask);
    if (m_StagingBuffer)
        m_pDevice->SafeReleaseDeviceObject(std::move(m_StagingBuffer), m_Desc.ImmediateContextMask);
    m_pDevice->SafeReleaseDeviceObject(std::move(m_MemoryAllocation), m_Desc.ImmediateContextMask);
}